

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

QSize __thiscall QTabWidget::minimumSizeHint(QTabWidget *this)

{
  long lVar1;
  QTabWidgetPrivate *this_00;
  QWidget *pQVar2;
  bool bVar3;
  QPalette *pQVar4;
  QStyle *pQVar5;
  QSize QVar6;
  QTabWidget *that;
  long in_FS_OFFSET;
  QSize local_d8;
  QSize local_d0;
  QSize local_c8;
  QSize local_c0;
  QSize local_b8;
  QStyleOptionTabWidgetFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
  local_b8.wd.m_i = 0;
  local_b8.ht.m_i = 0;
  local_c0.wd.m_i = 0;
  local_c0.ht.m_i = 0;
  pQVar2 = this_00->leftCornerWidget;
  if ((pQVar2 != (QWidget *)0x0) && ((pQVar2->data->widget_attributes & 0x8000) != 0)) {
    local_b8 = (QSize)(**(code **)(*(long *)pQVar2 + 0x78))();
  }
  pQVar2 = this_00->rightCornerWidget;
  if ((pQVar2 != (QWidget *)0x0) && ((pQVar2->data->widget_attributes & 0x8000) != 0)) {
    local_c0 = (QSize)(**(code **)(*(long *)pQVar2 + 0x78))();
  }
  if (this_00->dirty == false) {
    setUpLayout(this,true);
  }
  local_c8 = (QSize)(**(code **)(*(long *)&(this_00->stack->super_QFrame).super_QWidget + 0x78))();
  local_d0.wd.m_i = -1;
  local_d0.ht.m_i = -1;
  bVar3 = QTabWidgetPrivate::isAutoHidden(this_00);
  if (!bVar3) {
    local_d0 = (QSize)(**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x78))();
  }
  local_d8 = basicSize(this_00->pos < West,&local_b8,&local_c0,&local_c8,&local_d0);
  memset(&opt,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&opt);
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&opt);
  pQVar4 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=(&opt.super_QStyleOption.palette,pQVar4);
  opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
  pQVar5 = QWidget::style(&this->super_QWidget);
  QVar6 = (QSize)(**(code **)(*(long *)pQVar5 + 0xe8))(pQVar5,0x11,&opt,&local_d8,this);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QSize QTabWidget::minimumSizeHint() const
{
    Q_D(const QTabWidget);
    QSize lc(0, 0), rc(0, 0);

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->minimumSizeHint();
    if (d->rightCornerWidget && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->minimumSizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize s(d->stack->minimumSizeHint());
    QSize t;
    if (!d->isAutoHidden())
        t = d->tabs->minimumSizeHint();

    QSize sz = basicSize(d->pos == North || d->pos == South, lc, rc, s, t);

    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.palette = palette();
    opt.state = QStyle::State_None;
    return style()->sizeFromContents(QStyle::CT_TabWidget, &opt, sz, this);
}